

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O3

bool spvtools::opt::(anonymous_namespace)::AnyTypeOf<bool(*)(spvtools::opt::Instruction_const*)>
               (Instruction *instruction,_func_bool_Instruction_ptr *predicate)

{
  Op op;
  IRContext *this;
  DefUseManager *this_00;
  pointer pOVar1;
  uint **ppuVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int32_t iVar6;
  _Elt_pointer puVar7;
  Instruction *instruction_00;
  ulong uVar8;
  uint **ppuVar9;
  uint32_t uVar10;
  uint uVar11;
  bool bVar12;
  pointer pOVar13;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
  instructions_to_visit;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> **local_d0;
  undefined8 local_c8;
  code *local_c0;
  code *local_b8;
  uint *local_b0;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  op = instruction->opcode_;
  iVar6 = spvOpcodeGeneratesType(op);
  if ((op != OpTypeForwardPointer) && (iVar6 == 0)) {
    __assert_fail("IsTypeInst(instruction->opcode()) && \"AnyTypeOf called with a non-type instruction.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                  ,100,
                  "bool spvtools::opt::(anonymous namespace)::AnyTypeOf(const Instruction *, UnaryPredicate) [UnaryPredicate = bool (*)(const spvtools::opt::Instruction *)]"
                 );
  }
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  uVar10 = 0;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(&local_a8,0);
  if (instruction->has_result_id_ == true) {
    uVar10 = Instruction::GetSingleWordOperand(instruction,(uint)instruction->has_type_id_);
  }
  local_d0 = (_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> **)
             CONCAT44(local_d0._4_4_,uVar10);
  std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,(uint *)&local_d0);
  this = instruction->context_;
  if ((this->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this);
  }
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    bVar12 = false;
  }
  else {
    this_00 = (this->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    bVar12 = false;
    do {
      puVar7 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        puVar7 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      instruction_00 = analysis::DefUseManager::GetDef(this_00,puVar7[-1]);
      if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        operator_delete(local_a8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80;
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f;
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      bVar3 = true;
      if (((!bVar12) && (bVar4 = anon_unknown_10::is16bitType(instruction_00), !bVar4)) &&
         (uVar8 = (ulong)instruction_00->opcode_, bVar3 = bVar12, uVar8 < 0x21)) {
        if ((0x31800000UL >> (uVar8 & 0x3f) & 1) == 0) {
          if (uVar8 == 0x1e) {
            local_48 = 0;
            local_50 = &local_a8;
            local_38 = std::
                       _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:86:30)>
                       ::_M_invoke;
            local_40 = std::
                       _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:86:30)>
                       ::_M_manager;
            local_c8 = 0;
            local_d0 = &local_50;
            local_b8 = std::
                       _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:884:22)>
                       ::_M_invoke;
            local_c0 = std::
                       _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:884:22)>
                       ::_M_manager;
            pOVar13 = (instruction_00->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pOVar1 = (instruction_00->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (pOVar13 == pOVar1) {
LAB_001a2393:
              (*local_c0)(&local_d0,&local_d0,3);
            }
            else {
              do {
                if ((pOVar13->type & ~SPV_OPERAND_TYPE_ID) != SPV_OPERAND_TYPE_TYPE_ID) {
                  ppuVar2 = (uint **)(pOVar13->words).large_data_._M_t.
                                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                     ._M_head_impl;
                  ppuVar9 = &(pOVar13->words).small_data_;
                  if (ppuVar2 != (uint **)0x0) {
                    ppuVar9 = ppuVar2;
                  }
                  local_b0 = *ppuVar9;
                  if (local_c0 == (code *)0x0) {
                    std::__throw_bad_function_call();
                  }
                  cVar5 = (*local_b8)(&local_d0,&local_b0);
                  if (cVar5 == '\0') break;
                }
                pOVar13 = pOVar13 + 1;
              } while (pOVar13 != pOVar1);
              if (local_c0 != (code *)0x0) goto LAB_001a2393;
            }
            if (local_40 != (code *)0x0) {
              (*local_40)(&local_50,&local_50,3);
            }
            goto LAB_001a22a0;
          }
          if (uVar8 != 0x20) goto LAB_001a22a0;
          uVar11 = (instruction_00->has_result_id_ & 1) + 1;
          if (instruction_00->has_type_id_ == false) {
            uVar11 = (uint)instruction_00->has_result_id_;
          }
          uVar10 = uVar11 + 1;
        }
        else {
          uVar10 = (instruction_00->has_result_id_ & 1) + 1;
          if (instruction_00->has_type_id_ == false) {
            uVar10 = (uint)instruction_00->has_result_id_;
          }
        }
        uVar10 = Instruction::GetSingleWordOperand(instruction_00,uVar10);
        local_d0 = (_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> **)
                   CONCAT44(local_d0._4_4_,uVar10);
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,(uint *)&local_d0
                  );
      }
LAB_001a22a0:
      bVar12 = bVar3;
    } while (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_a8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_a8);
  return bVar12;
}

Assistant:

static bool AnyTypeOf(const Instruction* instruction,
                      UnaryPredicate predicate) {
  assert(IsTypeInst(instruction->opcode()) &&
         "AnyTypeOf called with a non-type instruction.");

  bool found_one = false;
  DFSWhile(instruction, [&found_one, predicate](const Instruction* node) {
    if (found_one || predicate(node)) {
      found_one = true;
      return false;
    }

    return true;
  });
  return found_one;
}